

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O3

void PALCommonCleanup(void)

{
  if (PALCommonCleanup::cleanupDone != '\0') {
    return;
  }
  PALCommonCleanup::cleanupDone = 1;
  shutdown_intent.m_val = 1;
  CorUnix::CPalSynchMgrController::PrepareForShutdown();
  PROCDumpThreadList();
  return;
}

Assistant:

void
PALCommonCleanup()
{
    static bool cleanupDone = false;

    if (!cleanupDone)
    {
        cleanupDone = true;

        PALSetShutdownIntent();

        //
        // Let the synchronization manager know we're about to shutdown
        //

        CPalSynchMgrController::PrepareForShutdown();

#ifdef _DEBUG
        PROCDumpThreadList();
#endif
    }
}